

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O1

bool __thiscall
iDynTree::BoundingBoxProjectionConstraint::buildBoundingBox
          (BoundingBoxProjectionConstraint *this,Direction *xAxisOfPlaneInWorld,
          Direction *yAxisOfPlaneInWorld,Position *originOfPlaneInWorld,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
          *supportPolygonsExpressedInSupportFrame,
          vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>
          *absoluteFrame_X_supportFrame)

{
  pointer pVVar1;
  double dVar2;
  double dVar3;
  iterator iVar4;
  size_t sVar5;
  Position *pPVar6;
  PointerType ptr_2;
  PointerType ptr;
  long lVar7;
  ulong idx;
  VectorFixSize<2U> *pVVar8;
  pointer pPVar9;
  undefined8 uVar10;
  PointerType ptr_1;
  ulong uVar11;
  iterator __end1;
  long lVar12;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar13;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  pVar14;
  vector<double,_std::allocator<double>_> xCoords;
  vector<double,_std::allocator<double>_> yCoords;
  vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_> projectedPoints
  ;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
  supportPolygonsExpressedInAbsoluteFrame;
  VectorFixSize<2U> point;
  Polygon local_e8;
  VectorFixSize<2U> local_c8;
  double *local_b8;
  VectorFixSize<2U> *local_a8;
  iterator iStack_a0;
  VectorFixSize<2U> *local_98;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *local_88;
  vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *local_80;
  vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> local_78;
  double local_58;
  double adStack_50 [2];
  double local_40;
  double local_38;
  
  local_80 = absoluteFrame_X_supportFrame;
  iDynTree::Position::operator=(&this->o,originOfPlaneInWorld);
  uVar10 = *(undefined8 *)(xAxisOfPlaneInWorld + 8);
  *(undefined8 *)&this->P = *(undefined8 *)xAxisOfPlaneInWorld;
  *(undefined8 *)&this->field_0x70 = uVar10;
  *(undefined8 *)&this->field_0x78 = *(undefined8 *)(xAxisOfPlaneInWorld + 0x10);
  uVar10 = *(undefined8 *)(yAxisOfPlaneInWorld + 8);
  *(undefined8 *)&this->field_0x80 = *(undefined8 *)yAxisOfPlaneInWorld;
  *(undefined8 *)&this->field_0x88 = uVar10;
  *(undefined8 *)&this->field_0x90 = *(undefined8 *)(yAxisOfPlaneInWorld + 0x10);
  local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::resize
            (&local_78,
             ((long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(supportPolygonsExpressedInSupportFrame->
                    super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pPVar9 = (supportPolygonsExpressedInSupportFrame->
           super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_88 = supportPolygonsExpressedInSupportFrame;
  if ((supportPolygonsExpressedInSupportFrame->
      super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar9) {
    lVar7 = 0;
    lVar12 = 0;
    uVar11 = 0;
    do {
      Polygon::applyTransform
                (&local_e8,
                 (Polygon *)
                 ((long)&(pPVar9->m_vertices).
                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12),
                 (Transform *)(*(long *)local_80 + lVar7));
      std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::_M_move_assign
                ((vector<iDynTree::Position,_std::allocator<iDynTree::Position>_> *)
                 ((long)&((local_78.
                           super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_vertices).
                         super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12),&local_e8);
      if (local_e8.m_vertices.
          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.m_vertices.
                              super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.m_vertices.
                              super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar11 = uVar11 + 1;
      pPVar9 = (local_88->super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x18;
      lVar7 = lVar7 + 0x60;
    } while (uVar11 < (ulong)(((long)(local_88->
                                     super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >> 3
                              ) * -0x5555555555555555));
  }
  local_a8 = (VectorFixSize<2U> *)0x0;
  iStack_a0._M_current = (VectorFixSize<2U> *)0x0;
  local_98 = (VectorFixSize<2U> *)0x0;
  if (local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      idx = 0;
      while( true ) {
        sVar5 = Polygon::getNrOfVertices
                          (local_78.
                           super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar11);
        if (sVar5 <= idx) break;
        pPVar6 = Polygon::operator()(local_78.
                                     super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar11,idx);
        iDynTree::Position::operator-((Position *)&local_e8,pPVar6);
        dVar2 = (double)local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage *
                *(double *)&this->field_0x78 +
                *(double *)&this->field_0x70 *
                (double)local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                *(double *)&this->P *
                (double)local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        dVar3 = (double)local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage *
                *(double *)&this->field_0x90 +
                *(double *)&this->field_0x88 *
                (double)local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                *(double *)&this->field_0x80 *
                (double)local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        local_c8.m_data[1]._0_4_ = SUB84(dVar3,0);
        local_c8.m_data[0] = dVar2;
        local_c8.m_data[1]._4_4_ = (int)((ulong)dVar3 >> 0x20);
        if (iStack_a0._M_current == local_98) {
          std::vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>::
          _M_realloc_insert<iDynTree::VectorFixSize<2u>const&>
                    ((vector<iDynTree::VectorFixSize<2u>,std::allocator<iDynTree::VectorFixSize<2u>>>
                      *)&local_a8,iStack_a0,&local_c8);
        }
        else {
          (iStack_a0._M_current)->m_data[0] = dVar2;
          (iStack_a0._M_current)->m_data[1] = local_c8.m_data[1];
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
        idx = idx + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)local_78.
                                     super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_78.
                                     super__Vector_base<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  iVar4._M_current = (VectorFixSize<2U> *)iStack_a0;
  if (0x20 < (ulong)((long)iStack_a0._M_current - (long)local_a8)) {
    local_e8.m_vertices.super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.m_vertices.super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.m_vertices.super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8 = (double *)0x0;
    local_c8.m_data = (double  [2])ZEXT816(0);
    if (local_a8 != iStack_a0._M_current) {
      pVVar8 = local_a8;
      do {
        local_58 = pVVar8->m_data[0];
        adStack_50[0] = pVVar8->m_data[1];
        if (local_e8.m_vertices.
            super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_e8.m_vertices.
            super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_e8,
                     (iterator)
                     local_e8.m_vertices.
                     super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_58);
        }
        else {
          *(double *)
           local_e8.m_vertices.
           super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
           super__Vector_impl_data._M_finish = local_58;
          local_e8.m_vertices.
          super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)local_e8.m_vertices.
                               super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8);
        }
        if ((double *)local_c8.m_data[1] == local_b8) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_c8,(iterator)local_c8.m_data[1]
                     ,adStack_50);
        }
        else {
          *(double *)local_c8.m_data[1] = adStack_50[0];
          local_c8.m_data[1] = (double)((long)local_c8.m_data[1] + 8);
        }
        pVVar8 = pVVar8 + 1;
      } while (pVVar8 != iVar4._M_current);
    }
    pVar13 = std::
             __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                       (local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        local_e8.m_vertices.
                        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    pVar14 = std::
             __minmax_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                       (local_c8.m_data[0],local_c8.m_data[1]);
    local_40 = *pVar13.first._M_current._M_current;
    local_80 = (vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
               *pVar13.second._M_current._M_current;
    local_38 = *pVar14.first._M_current._M_current;
    local_88 = (vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *)
               *pVar14.second._M_current._M_current;
    std::vector<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>::resize
              (&(this->projectedBoundingBox).m_vertices,4);
    pVVar1 = (this->projectedBoundingBox).m_vertices.
             super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->projectedBoundingBox).m_vertices.
        super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pVVar1) {
      uVar10 = 0;
      uVar11 = 0;
    }
    else {
      pVVar1->m_data[0] = local_40;
      pVVar1->m_data[1] = (double)local_88;
      pVVar1 = (this->projectedBoundingBox).m_vertices.
               super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(this->projectedBoundingBox).m_vertices.
                     super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4;
      if (uVar11 < 2) {
        uVar10 = 1;
      }
      else {
        pVVar1[1].m_data[0] = local_40;
        pVVar1[1].m_data[1] = local_38;
        pVVar1 = (this->projectedBoundingBox).m_vertices.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (long)(this->projectedBoundingBox).m_vertices.
                       super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4;
        if (uVar11 < 3) {
          uVar10 = 2;
        }
        else {
          pVVar1[2].m_data[0] = (double)local_80;
          pVVar1[2].m_data[1] = local_38;
          pVVar1 = (this->projectedBoundingBox).m_vertices.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = (long)(this->projectedBoundingBox).m_vertices.
                         super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4;
          if (3 < uVar11) {
            pVVar1[3].m_data[0] = (double)local_80;
            pVVar1[3].m_data[1] = (double)local_88;
            buildConstraintMatrix(this);
            if ((void *)local_c8.m_data[0] != (void *)0x0) {
              operator_delete((void *)local_c8.m_data[0],(long)local_b8 - (long)local_c8.m_data[0]);
            }
            if (local_e8.m_vertices.
                super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.m_vertices.
                              super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_e8.m_vertices.
                                    super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e8.m_vertices.
                                    super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_00109bf0;
          }
          uVar10 = 3;
        }
      }
    }
    uVar10 = std::__throw_out_of_range_fmt
                       ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                        uVar10,uVar11);
    if ((void *)local_c8.m_data[0] != (void *)0x0) {
      operator_delete((void *)local_c8.m_data[0],(long)local_b8 - (long)local_c8.m_data[0]);
    }
    if (local_e8.m_vertices.
        super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.m_vertices.
                      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.m_vertices.
                            super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.m_vertices.
                            super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8 != (VectorFixSize<2U> *)0x0) {
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
    }
    std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector(&local_78);
    _Unwind_Resume(uVar10);
  }
LAB_00109bf0:
  if (local_a8 != (VectorFixSize<2U> *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  std::vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_>::~vector(&local_78);
  return false;
}

Assistant:

bool BoundingBoxProjectionConstraint::buildBoundingBox(const iDynTree::Direction xAxisOfPlaneInWorld,
                                                         const iDynTree::Direction yAxisOfPlaneInWorld,
                                                         const iDynTree::Position originOfPlaneInWorld,
                                                         const std::vector<Polygon> &supportPolygonsExpressedInSupportFrame,
                                                         const std::vector<Transform> &absoluteFrame_X_supportFrame)
    {
      o = originOfPlaneInWorld;
      toEigen(P).block<1, 3>(0,0) = toEigen(xAxisOfPlaneInWorld);
      toEigen(P).block<1, 3>(1,0) = toEigen(yAxisOfPlaneInWorld);

      // Transform the polygons in the absolute frame
      std::vector<Polygon> supportPolygonsExpressedInAbsoluteFrame;

      supportPolygonsExpressedInAbsoluteFrame.resize(supportPolygonsExpressedInSupportFrame.size());

      for(size_t i=0; i< supportPolygonsExpressedInSupportFrame.size(); i++)
      {
          supportPolygonsExpressedInAbsoluteFrame[i] = supportPolygonsExpressedInSupportFrame[i].applyTransform(absoluteFrame_X_supportFrame[i]);
      }

      // Project the polygons on the projection plane
      std::vector<Vector2> projectedPoints;

      for(size_t poly=0; poly < supportPolygonsExpressedInAbsoluteFrame.size(); poly++)
      {
          for(size_t vertex=0; vertex < supportPolygonsExpressedInAbsoluteFrame[poly].getNrOfVertices(); vertex++)
          {
               Vector2 newProjectedPoint = project(supportPolygonsExpressedInAbsoluteFrame[poly](vertex));
               //toEigen(newProjectedPoint) = toEigen(P)*toEigen(supportPolygonsExpressedInAbsoluteFrame[poly](vertex)-o);
               projectedPoints.push_back(newProjectedPoint);
          }
      }

      if (projectedPoints.size() <= 2)
      {
          return false;
      }

      // Compute the bounding box
      //  Build a vector from projectedPoints with the x coordinates
      std::vector<double> xCoords;
      std::vector<double> yCoords;
      for (auto point : projectedPoints) {
          xCoords.push_back(point(0));
          yCoords.push_back(point(1));
      }

      // Find min and max x coordinate
      auto minMaxXCoord = std::minmax_element(xCoords.begin(), xCoords.end());
      auto minMaxYCoord = std::minmax_element(yCoords.begin(), yCoords.end());
      double minX, maxX, minY, maxY;
      minX = *minMaxXCoord.first;
      maxX = *minMaxXCoord.second;
      minY = *minMaxYCoord.first;
      maxY = *minMaxYCoord.second;

      // Compute bounding box
      Vector2 vec1, vec2, vec3, vec4;
      vec1(0) = minX; vec1(1) = maxY;
      vec2(0) = maxX; vec2(1) = maxY;
      vec3(0) = maxX; vec3(1) = minY;
      vec4(0) = minX; vec4(1) = minY;

      projectedBoundingBox.m_vertices.resize(4);
      projectedBoundingBox.m_vertices.at(0) = vec1;
      projectedBoundingBox.m_vertices.at(1) = vec4;
      projectedBoundingBox.m_vertices.at(2) = vec3;
      projectedBoundingBox.m_vertices.at(3) = vec2;

      // Build the constraint matrix
      buildConstraintMatrix();
      return false;

      // Update AtimesP matrix
      AtimesP.resize(A.rows(),P.cols());

      toEigen(AtimesP) = toEigen(A)*toEigen(P);

      return true;
    }